

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

bool __thiscall QPDF::isLinearized(QPDF *this)

{
  long *plVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  char cVar3;
  int iVar4;
  unsigned_long i;
  longlong lVar5;
  long lVar6;
  long *plVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  string buffer;
  QPDFObjectHandle linkey;
  QPDFObjectHandle L;
  QPDFObjectHandle candidate;
  Token t1;
  long *local_1c0 [2];
  long local_1b0 [2];
  QPDFObjectHandle local_1a0;
  undefined1 local_190 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  size_type *local_170;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  double local_108;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Token local_98;
  
  plVar7 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct((ulong)local_1c0,'\0');
  (**(code **)(*plVar7 + 0x28))(plVar7,0,0);
  std::__cxx11::string::resize((ulong)local_1c0,'\0');
  cVar3 = (**(code **)(*plVar7 + 0x38))(plVar7,local_1c0[0],0x400);
  std::__cxx11::string::resize((ulong)local_1c0,cVar3);
  i = 0;
  do {
    i = std::__cxx11::string::find_first_of((char *)local_1c0,0x27d29e,i);
    if (i == 0xffffffffffffffff) {
      bVar8 = false;
      break;
    }
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    if ((long)i < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
    }
    (**(code **)(*plVar1 + 0x28))(plVar1,i,0);
    readToken(&local_98,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x14);
    if (local_98.type == tt_integer) {
      readToken((Token *)&local_170,this,
                (((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6);
      bVar8 = true;
      if ((token_type_e)local_170 == tt_integer) {
        readToken((Token *)local_100,this,
                  (((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
        local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_190;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"obj","");
        bVar8 = true;
        if ((local_100._0_4_ == tt_word) &&
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._16_8_ ==
            local_1a0.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._16_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar8 = false;
          }
          else {
            iVar4 = bcmp((void *)local_100._8_8_,
                         local_1a0.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         local_100._16_8_);
            bVar8 = iVar4 != 0;
          }
        }
        if (local_1a0.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_190) {
          operator_delete(local_1a0.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_190._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._8_8_ != &local_e8) {
          operator_delete((void *)local_100._8_8_,local_e8._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != &local_138) {
        operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
      }
      if (bVar8) goto LAB_00213794;
      lVar5 = QUtil::string_to_ll(local_98.value._M_dataplus._M_p);
      if ((int)lVar5 != lVar5) {
        QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar5);
      }
      getObject((QPDF *)local_100,(int)this,(int)lVar5);
      bVar8 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_100);
      if (bVar8) {
        local_170 = &local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/Linearized","");
        QPDFObjectHandle::getKey(&local_1a0,(string *)local_100);
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        bVar8 = QPDFObjectHandle::isNumber(&local_1a0);
        if (bVar8) {
          dVar10 = QPDFObjectHandle::getNumericValue(&local_1a0);
          dVar10 = floor(dVar10);
          if ((dVar10 < -2147483648.0) || (2147483647.0 < dVar10)) {
            local_108 = dVar10;
            QIntC::IntConverter<double,_int,_true,_true>::error(dVar10);
            dVar10 = local_108;
          }
          if ((int)dVar10 != 1) goto LAB_0021399b;
          local_170 = &local_160;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/L","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_190 + 0x10),(string *)local_100);
          if (local_170 != &local_160) {
            operator_delete(local_170,local_160 + 1);
          }
          bVar8 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_190 + 0x10));
          if (bVar8) {
            lVar5 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)(local_190 + 0x10));
            plVar7 = *(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
            (**(code **)(*plVar7 + 0x28))(plVar7,0,2);
            lVar6 = (**(code **)(**(long **)&(((this->m)._M_t.
                                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                              _M_head_impl)->file).
                                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                + 0x20))();
            if (lVar5 != lVar6) goto LAB_00213a3b;
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            ((_Var2._M_head_impl)->linp).file_size = lVar5;
            *(ulong *)&((_Var2._M_head_impl)->lindict).super_BaseHandle =
                 CONCAT44(local_100._4_4_,local_100._0_4_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(_Var2._M_head_impl)->lindict + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
            plVar7 = (long *)0x1;
          }
          else {
LAB_00213a3b:
            plVar7 = (long *)0x0;
          }
          if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
          }
        }
        else {
LAB_0021399b:
          plVar7 = (long *)0x0;
        }
        if (local_1a0.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      else {
        plVar7 = (long *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      bVar9 = false;
    }
    else {
LAB_00213794:
      i = std::__cxx11::string::find_first_not_of((char *)local_1c0,0x27d29e,i);
      bVar9 = i != 0xffffffffffffffff;
      plVar7 = (long *)(ulong)((byte)plVar7 & bVar9);
    }
    bVar8 = SUB81(plVar7,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.error_message._M_dataplus._M_p != &local_98.error_message.field_2) {
      operator_delete(local_98.error_message._M_dataplus._M_p,
                      local_98.error_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.raw_value._M_dataplus._M_p != &local_98.raw_value.field_2) {
      operator_delete(local_98.raw_value._M_dataplus._M_p,
                      local_98.raw_value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.value._M_dataplus._M_p != &local_98.value.field_2) {
      operator_delete(local_98.value._M_dataplus._M_p,
                      local_98.value.field_2._M_allocated_capacity + 1);
    }
  } while (bVar9);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return bVar8;
}

Assistant:

bool
QPDF::isLinearized()
{
    // If the first object in the file is a dictionary with a suitable /Linearized key and has an /L
    // key that accurately indicates the file size, initialize m->lindict and return true.

    // A linearized PDF spec's first object will be contained within the first 1024 bytes of the
    // file and will be a dictionary with a valid /Linearized key.  This routine looks for that and
    // does no additional validation.

    // The PDF spec says the linearization dictionary must be completely contained within the first
    // 1024 bytes of the file. Add a byte for a null terminator.
    auto buffer = m->file->read(1024, 0);
    size_t pos = 0;
    while (true) {
        // Find a digit or end of buffer
        pos = buffer.find_first_of("0123456789"sv, pos);
        if (pos == std::string::npos) {
            return false;
        }
        // Seek to the digit. Then skip over digits for a potential
        // next iteration.
        m->file->seek(toO(pos), SEEK_SET);

        auto t1 = readToken(*m->file, 20);
        if (!(t1.isInteger() && readToken(*m->file, 6).isInteger() &&
              readToken(*m->file, 4).isWord("obj"))) {
            pos = buffer.find_first_not_of("0123456789"sv, pos);
            if (pos == std::string::npos) {
                return false;
            }
            continue;
        }

        auto candidate = getObject(toI(QUtil::string_to_ll(t1.getValue().data())), 0);
        if (!candidate.isDictionary()) {
            return false;
        }

        auto linkey = candidate.getKey("/Linearized");
        if (!(linkey.isNumber() && toI(floor(linkey.getNumericValue())) == 1)) {
            return false;
        }

        auto L = candidate.getKey("/L");
        if (!L.isInteger()) {
            return false;
        }
        qpdf_offset_t Li = L.getIntValue();
        m->file->seek(0, SEEK_END);
        if (Li != m->file->tell()) {
            QTC::TC("qpdf", "QPDF /L mismatch");
            return false;
        }
        m->linp.file_size = Li;
        m->lindict = candidate;
        return true;
    }
}